

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  FieldType FVar1;
  Extension *pEVar2;
  LogMessage local_20;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0xfb);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_20,
               (char (*) [58])"Don\'t lookup extension types if they aren\'t present (1). ");
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_20);
    FVar1 = '\0';
  }
  else {
    if ((pEVar2->field_0xa & 2) != 0) {
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x100);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_20,
                 (char (*) [58])"Don\'t lookup extension types if they aren\'t present (2). ");
      absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_20);
    }
    FVar1 = pEVar2->type;
  }
  return FVar1;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) {
    ABSL_DLOG(FATAL)
        << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (ext->is_cleared) {
    ABSL_DLOG(FATAL)
        << "Don't lookup extension types if they aren't present (2). ";
  }
  return ext->type;
}